

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O0

int __thiscall soplex::SVSetBase<double>::remove(SVSetBase<double> *this,char *__filename)

{
  int iVar1;
  int i;
  int j;
  DLPSV *in_stack_00000018;
  SVSetBase<double> *in_stack_00000020;
  int local_18;
  
  local_18 = num((SVSetBase<double> *)0x22fbfd);
  while (local_18 = local_18 + -1, -1 < local_18) {
    if (*(int *)(__filename + (long)local_18 * 4) < 0) {
      ClassSet<soplex::SVSetBase<double>::DLPSV>::operator[](&this->set,local_18);
      deleteVec(in_stack_00000020,in_stack_00000018);
    }
  }
  iVar1 = ClassSet<soplex::SVSetBase<double>::DLPSV>::remove(&this->set,__filename);
  return iVar1;
}

Assistant:

void remove(int perm[])
   {
      int j = num();

      /* due to performance reasons we use a backwards loop to delete entries, because it could result instead of only
       * decreasing the number of elements j times in memmoving the whole array j times
       */
      for(int i = j - 1; i >= 0; --i)
      {
         if(perm[i] < 0)
         {
            deleteVec(&set[i]);
         }
      }

      set.remove(perm);
   }